

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

iterator * __thiscall
google::
sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
::find<HashObject<256,32>>
          (iterator *__return_storage_ptr__,
          sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
          *this,HashObject<256,_32> *key)

{
  sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  *psVar1;
  sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  *psVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  nonempty_iterator local_40;
  
  if (*(long *)(this + 0x148) != *(long *)(this + 0x120)) {
    pVar3 = find_position<HashObject<256,32>>(this,key);
    if (pVar3.first != 0xffffffffffffffff) {
      sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::get_iter(&local_40,
                 (sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                  *)(this + 0x128),pVar3.first);
      psVar1 = *(sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                 **)(this + 0x128);
      psVar2 = *(sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                 **)(this + 0x130);
      (__return_storage_ptr__->pos).row_current._M_current = local_40.row_current._M_current;
      (__return_storage_ptr__->pos).col_current = local_40.col_current;
      (__return_storage_ptr__->pos).row_begin._M_current = local_40.row_begin._M_current;
      (__return_storage_ptr__->pos).row_end._M_current = local_40.row_end._M_current;
      __return_storage_ptr__->ht =
           (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)this;
      (__return_storage_ptr__->end).row_begin._M_current = psVar1;
      (__return_storage_ptr__->end).row_end._M_current = psVar2;
      (__return_storage_ptr__->end).row_current._M_current = psVar2;
      (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
      goto LAB_00138539;
    }
  }
  psVar1 = *(sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             **)(this + 0x128);
  psVar2 = *(sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             **)(this + 0x130);
  __return_storage_ptr__->ht =
       (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)this;
  (__return_storage_ptr__->pos).row_begin._M_current = psVar1;
  (__return_storage_ptr__->pos).row_end._M_current = psVar2;
  (__return_storage_ptr__->pos).row_current._M_current = psVar2;
  (__return_storage_ptr__->pos).col_current = (nonempty_iterator)0x0;
  (__return_storage_ptr__->end).row_begin._M_current = psVar1;
  (__return_storage_ptr__->end).row_end._M_current = psVar2;
  (__return_storage_ptr__->end).row_current._M_current = psVar2;
  (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
LAB_00138539:
  sparse_hashtable_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table.get_iter(pos.first), table.nonempty_end());
  }